

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void * nk_draw_list_alloc_vertices(nk_draw_list *list,nk_size count)

{
  void *pvVar1;
  
  pvVar1 = nk_buffer_alloc(list->vertices,NK_BUFFER_FRONT,(list->config).vertex_size * count,
                           (list->config).vertex_alignment);
  if (pvVar1 != (void *)0x0) {
    list->vertex_count = list->vertex_count + (int)count;
  }
  return pvVar1;
}

Assistant:

NK_INTERN void*
nk_draw_list_alloc_vertices(struct nk_draw_list *list, nk_size count)
{
    void *vtx;
    NK_ASSERT(list);
    if (!list) return 0;
    vtx = nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT,
        list->config.vertex_size*count, list->config.vertex_alignment);
    if (!vtx) return 0;
    list->vertex_count += (unsigned int)count;
    return vtx;
}